

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

ListSchema capnp::ListSchema::of(Reader elementType,Schema context)

{
  Reader elementType_00;
  Which WVar1;
  uint64_t uVar2;
  ListSchema elementType_01;
  Type local_180 [2];
  Fault local_160;
  Fault f;
  Reader local_150;
  Reader local_120;
  Type local_f0;
  Reader local_e0;
  Schema local_b0;
  Schema local_a8;
  Reader local_a0;
  Schema local_70;
  Schema local_68;
  Reader local_60;
  Schema local_30;
  Schema local_28;
  Schema local_20;
  Schema context_local;
  
  local_20.raw = context.raw;
  WVar1 = capnp::schema::Type::Reader::which(&elementType);
  switch(WVar1) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    WVar1 = capnp::schema::Type::Reader::which(&elementType);
    _context_local = (Type)of(WVar1);
    break;
  case LIST:
    capnp::schema::Type::Reader::getList(&local_150,&elementType);
    capnp::schema::Type::List::Reader::getElementType(&local_120,&local_150);
    f.exception = (Exception *)local_20.raw;
    elementType_00._reader.capTable = local_120._reader.capTable;
    elementType_00._reader.segment = local_120._reader.segment;
    elementType_00._reader.data = local_120._reader.data;
    elementType_00._reader.pointers = local_120._reader.pointers;
    elementType_00._reader.dataSize = local_120._reader.dataSize;
    elementType_00._reader.pointerCount = local_120._reader.pointerCount;
    elementType_00._reader._38_2_ = local_120._reader._38_2_;
    elementType_00._reader.nestingLimit = local_120._reader.nestingLimit;
    elementType_00._reader._44_4_ = local_120._reader._44_4_;
    local_f0 = (Type)of(elementType_00,local_20);
    elementType_01.elementType.field_4 = local_f0.field_4;
    elementType_01.elementType._0_8_ = elementType_01.elementType.field_4;
    _context_local = (Type)of((ListSchema *)local_f0._0_8_,elementType_01);
    break;
  case ENUM:
    capnp::schema::Type::Reader::getEnum(&local_a0,&elementType);
    uVar2 = capnp::schema::Type::Enum::Reader::getTypeId(&local_a0);
    local_70 = Schema::getDependency(&local_20,uVar2);
    local_68.raw = (RawBrandedSchema *)Schema::asEnum(&local_70);
    _context_local = (Type)of((EnumSchema)local_68.raw);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct(&local_60,&elementType);
    uVar2 = capnp::schema::Type::Struct::Reader::getTypeId(&local_60);
    local_30 = Schema::getDependency(&local_20,uVar2);
    local_28.raw = (RawBrandedSchema *)Schema::asStruct(&local_30);
    _context_local = (Type)of((StructSchema)local_28.raw);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface(&local_e0,&elementType);
    uVar2 = capnp::schema::Type::Interface::Reader::getTypeId(&local_e0);
    local_b0 = Schema::getDependency(&local_20,uVar2);
    local_a8.raw = (RawBrandedSchema *)Schema::asInterface(&local_b0);
    _context_local = (Type)of((InterfaceSchema)local_a8.raw);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x306,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&local_160);
  default:
    WVar1 = capnp::schema::Type::Reader::which(&elementType);
    capnp::Type::Type(local_180,WVar1);
    ListSchema((ListSchema *)&context_local,local_180[0]);
  }
  return (ListSchema)_context_local;
}

Assistant:

ListSchema ListSchema::of(schema::Type::Reader elementType, Schema context) {
  // This method is deprecated because it can only be implemented in terms of other deprecated
  // methods. Temporarily disable warnings for those other deprecated methods.
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"

  switch (elementType.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return of(elementType.which());

    case schema::Type::STRUCT:
      return of(context.getDependency(elementType.getStruct().getTypeId()).asStruct());

    case schema::Type::ENUM:
      return of(context.getDependency(elementType.getEnum().getTypeId()).asEnum());

    case schema::Type::INTERFACE:
      return of(context.getDependency(elementType.getInterface().getTypeId()).asInterface());

    case schema::Type::LIST:
      return of(of(elementType.getList().getElementType(), context));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      return ListSchema();
  }

  // Unknown type is acceptable.
  return ListSchema(elementType.which());
#pragma GCC diagnostic pop
}